

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def.hpp
# Opt level: O2

string * __thiscall
upb::MessageDefPtr::MiniDescriptorEncode_abi_cxx11_
          (string *__return_storage_ptr__,MessageDefPtr *this)

{
  Arena arena;
  upb_StringView md;
  unique_ptr<upb_Arena,_void_(*)(upb_Arena_*)> local_30;
  upb_StringView local_20;
  
  local_30._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
  super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
  super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl = upb_Arena_New();
  local_30._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
  super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
  super__Tuple_impl<1UL,_void_(*)(upb_Arena_*)>.super__Head_base<1UL,_void_(*)(upb_Arena_*),_false>.
  _M_head_impl = (_Head_base<1UL,_void_(*)(upb_Arena_*),_false>)upb_Arena_Free;
  upb_MessageDef_MiniDescriptorEncode
            (this->ptr_,
             local_30._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
             super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
             super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl,&local_20);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_20.data,local_20.data + local_20.size);
  std::unique_ptr<upb_Arena,_void_(*)(upb_Arena_*)>::~unique_ptr(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string MiniDescriptorEncode() const {
    upb::Arena arena;
    upb_StringView md;
    upb_MessageDef_MiniDescriptorEncode(ptr_, arena.ptr(), &md);
    return std::string(md.data, md.size);
  }